

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O2

BasicValue *
cvm::Native::Length(BasicValue *__return_storage_ptr__,
                   list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int iVar3;
  
  p_Var1 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  iVar3 = 0;
  if (p_Var1 != (_List_node_base *)Args) {
    p_Var2 = p_Var1[4]._M_next;
    if (p_Var2 == (_List_node_base *)0x0) {
      if (*(int *)&p_Var1[1]._M_next == 3) {
        iVar3 = *(int *)&p_Var1[2]._M_next;
      }
    }
    else {
      iVar3 = (int)((ulong)((long)p_Var2->_M_prev - (long)p_Var2->_M_next) >> 6);
    }
  }
  __return_storage_ptr__->Type = IntType;
  (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StrVal).field_2;
  (__return_storage_ptr__->StrVal)._M_string_length = 0;
  (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->field_2).IntVal = iVar3;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

BasicValue
Native::Length(std::list<BasicValue, std::allocator<BasicValue>> &Args) {
  if (Args.empty())
    return 0;
  const BasicValue &Arg = Args.front();
  if (Arg.isArray())
    return static_cast<int>(Arg.ArrayPtr->size());
  if (Arg.isString())
    return static_cast<int>(Arg.StrVal.size());
  return 0;
}